

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall
kj::PathPtr::evalWin32(Path *__return_storage_ptr__,PathPtr *this,StringPtr pathText)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  undefined1 in_R9B;
  String *value;
  StringPtr path;
  StringPtr path_00;
  Vector<kj::String> newParts;
  ArrayBuilder<kj::String> local_68;
  Array<char> local_48;
  
  path_00.content.ptr = (char *)pathText.content.size_;
  path.content.size_ = (Vector<kj::String> *)pathText.content.ptr;
  sVar1 = (this->parts).size_;
  path.content.ptr = path_00.content.ptr;
  sVar2 = Path::countPartsWin32((Path *)path.content.size_,path);
  sVar2 = sVar2 + sVar1;
  local_68.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar2);
  local_68.endPtr = local_68.ptr + sVar2;
  local_68.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  value = (this->parts).ptr;
  local_68.pos = local_68.ptr;
  for (lVar3 = (this->parts).size_ * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    heapString((String *)&local_48,value);
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_68,(String *)&local_48);
    Array<char>::~Array(&local_48);
    value = value + 1;
  }
  path_00.content.size_ = 0;
  Path::evalWin32Impl(__return_storage_ptr__,(Path *)&local_68,path.content.size_,path_00,
                      (bool)in_R9B);
  ArrayBuilder<kj::String>::dispose(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::evalWin32(StringPtr pathText) const {
  Vector<String> newParts(parts.size() + Path::countPartsWin32(pathText));
  for (auto& p: parts) newParts.add(heapString(p));
  return Path::evalWin32Impl(kj::mv(newParts), pathText);
}